

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_factory.cpp
# Opt level: O2

unique_ptr<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>
n_e_s::core::MmuFactory::create_empty(void)

{
  __uniq_ptr_impl<n_e_s::core::Mmu,_std::default_delete<n_e_s::core::Mmu>_> _Var1;
  tuple<n_e_s::core::Mmu_*,_std::default_delete<n_e_s::core::Mmu>_> in_RAX;
  __uniq_ptr_data<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>,_true,_true> in_RDI;
  __uniq_ptr_impl<n_e_s::core::Mmu,_std::default_delete<n_e_s::core::Mmu>_> local_18;
  
  local_18._M_t.super__Tuple_impl<0UL,_n_e_s::core::Mmu_*,_std::default_delete<n_e_s::core::Mmu>_>.
  super__Head_base<0UL,_n_e_s::core::Mmu_*,_false>._M_head_impl =
       (tuple<n_e_s::core::Mmu_*,_std::default_delete<n_e_s::core::Mmu>_>)
       (tuple<n_e_s::core::Mmu_*,_std::default_delete<n_e_s::core::Mmu>_>)
       in_RAX.super__Tuple_impl<0UL,_n_e_s::core::Mmu_*,_std::default_delete<n_e_s::core::Mmu>_>.
       super__Head_base<0UL,_n_e_s::core::Mmu_*,_false>._M_head_impl;
  std::make_unique<n_e_s::core::Mmu>();
  _Var1._M_t.super__Tuple_impl<0UL,_n_e_s::core::Mmu_*,_std::default_delete<n_e_s::core::Mmu>_>.
  super__Head_base<0UL,_n_e_s::core::Mmu_*,_false>._M_head_impl =
       local_18._M_t.
       super__Tuple_impl<0UL,_n_e_s::core::Mmu_*,_std::default_delete<n_e_s::core::Mmu>_>.
       super__Head_base<0UL,_n_e_s::core::Mmu_*,_false>._M_head_impl;
  local_18._M_t.super__Tuple_impl<0UL,_n_e_s::core::Mmu_*,_std::default_delete<n_e_s::core::Mmu>_>.
  super__Head_base<0UL,_n_e_s::core::Mmu_*,_false>._M_head_impl =
       (tuple<n_e_s::core::Mmu_*,_std::default_delete<n_e_s::core::Mmu>_>)
       (_Tuple_impl<0UL,_n_e_s::core::Mmu_*,_std::default_delete<n_e_s::core::Mmu>_>)0x0;
  *(tuple<n_e_s::core::Mmu_*,_std::default_delete<n_e_s::core::Mmu>_> *)
   in_RDI.super___uniq_ptr_impl<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>._M_t.
   super__Tuple_impl<0UL,_n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>.
   super__Head_base<0UL,_n_e_s::core::IMmu_*,_false>._M_head_impl =
       _Var1._M_t.super__Tuple_impl<0UL,_n_e_s::core::Mmu_*,_std::default_delete<n_e_s::core::Mmu>_>
       .super__Head_base<0UL,_n_e_s::core::Mmu_*,_false>._M_head_impl;
  std::unique_ptr<n_e_s::core::Mmu,_std::default_delete<n_e_s::core::Mmu>_>::~unique_ptr
            ((unique_ptr<n_e_s::core::Mmu,_std::default_delete<n_e_s::core::Mmu>_> *)&local_18);
  return (__uniq_ptr_data<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>,_true,_true>)
         (tuple<n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>)
         in_RDI.super___uniq_ptr_impl<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>.
         _M_t.super__Tuple_impl<0UL,_n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>.
         super__Head_base<0UL,_n_e_s::core::IMmu_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<IMmu> MmuFactory::create_empty() {
    return std::make_unique<Mmu>();
}